

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_parseInt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  undefined8 in_RAX;
  char *pc;
  JSValue JVar2;
  int radix;
  
  radix = (int)((ulong)in_RAX >> 0x20);
  pc = JS_ToCString(ctx,*argv);
  if (pc == (char *)0x0) {
    JVar2 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    iVar1 = JS_ToInt32(ctx,&radix,argv[1]);
    if (iVar1 == 0) {
      if (radix == 0 || 0xffffffdc < radix - 0x25U) {
        iVar1 = skip_spaces(pc);
        JVar2 = js_atof(ctx,pc + iVar1,(char **)0x0,radix,0x401);
      }
      else {
        JVar2.tag = 7;
        JVar2.u.float64 = NAN;
      }
    }
    else {
      JVar2 = (JSValue)(ZEXT816(6) << 0x40);
    }
    JS_FreeCString(ctx,pc);
  }
  return JVar2;
}

Assistant:

static JSValue js_parseInt(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *str, *p;
    int radix, flags;
    JSValue ret;

    str = JS_ToCString(ctx, argv[0]);
    if (!str)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &radix, argv[1])) {
        JS_FreeCString(ctx, str);
        return JS_EXCEPTION;
    }
    if (radix != 0 && (radix < 2 || radix > 36)) {
        ret = JS_NAN;
    } else {
        p = str;
        p += skip_spaces(p);
        flags = ATOD_INT_ONLY | ATOD_ACCEPT_PREFIX_AFTER_SIGN;
        ret = js_atof(ctx, p, NULL, radix, flags);
    }
    JS_FreeCString(ctx, str);
    return ret;
}